

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

string * __thiscall
pbrt::ColorEncodingHandle::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ColorEncodingHandle *this)

{
  ulong uVar1;
  GammaColorEncoding *this_00;
  allocator<char> local_9;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          ).bits;
  this_00 = (GammaColorEncoding *)(uVar1 & 0xffffffffffff);
  if (this_00 == (GammaColorEncoding *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(nullptr)",&local_9);
  }
  else if (uVar1 >> 0x31 == 0) {
    LinearColorEncoding::ToString_abi_cxx11_(__return_storage_ptr__,(LinearColorEncoding *)this_00);
  }
  else if ((uVar1 & 0xffff000000000000) == 0x2000000000000) {
    sRGBColorEncoding::ToString_abi_cxx11_(__return_storage_ptr__,(sRGBColorEncoding *)this_00);
  }
  else {
    GammaColorEncoding::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ColorEncodingHandle::ToString() const {
    if (!ptr())
        return "(nullptr)";

    auto ts = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(ts);
}